

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O3

int CfdGetMnemonicWords(void *handle,char *language,char **mnemonic_words)

{
  size_type sVar1;
  bool bVar2;
  char *pcVar3;
  HDWalletApi api;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  wordlist;
  string lang;
  string words;
  HDWalletApi local_a9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  string local_90;
  string local_70;
  string local_50;
  
  cfd::Initialize();
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  bVar2 = cfd::capi::IsEmptyString(language);
  sVar1 = local_70._M_string_length;
  if (!bVar2) {
    strlen(language);
    std::__cxx11::string::_M_replace((ulong)&local_70,0,(char *)sVar1,(ulong)language);
  }
  cfd::api::HDWalletApi::GetMnemonicWordlist(&local_a8,&local_a9,&local_70);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90," ","");
  cfd::core::StringUtil::Join
            (&local_50,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_a8,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  pcVar3 = cfd::capi::CreateString((string *)&local_50);
  *mnemonic_words = pcVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  return 0;
}

Assistant:

int CfdGetMnemonicWords(
    void* handle, const char* language, char** mnemonic_words) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();

    std::string lang;
    if (!IsEmptyString(language)) {
      lang = language;
    }
    HDWalletApi api;
    std::vector<std::string> wordlist = api.GetMnemonicWordlist(lang);
    auto words = StringUtil::Join(wordlist, " ");
    *mnemonic_words = CreateString(words);
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}